

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

float diff_x(float (*floatpic) [512] [512],float *kernel,int x,int y,int n)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  
  lVar1 = (long)-n;
  pfVar2 = floatpic[2][x + lVar1] + y;
  fVar3 = 0.0;
  for (; lVar1 <= n; lVar1 = lVar1 + 1) {
    fVar3 = fVar3 + kernel[lVar1 + 2] * *pfVar2;
    pfVar2 = pfVar2 + 0x200;
  }
  return fVar3;
}

Assistant:

float diff_x(
float floatpic[PIC_T][PIC_X][PIC_Y],
float kernel[5],
int x, int y, int n)
{
int i;
float sum;

sum = 0.0;
for(i=(-n);i<=n;i++)
	{
	sum += kernel[i+2]*floatpic[2][x+i][y];
	}
return(sum);
}